

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  deUint32 target;
  deUint32 format;
  deUint32 type;
  float height;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  int width;
  int height_00;
  int xoffset;
  int yoffset;
  int iVar4;
  int iVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  PixelFormat *pPVar7;
  char *str;
  Context *pCVar8;
  NotSupportedError *this_00;
  void *data_00;
  bool bVar9;
  bool bVar10;
  int local_2f8;
  bool local_2e1;
  int y;
  int x;
  int yo;
  int xo;
  int h;
  int w;
  int face_1;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  Vector<float,_3> local_2ac;
  PixelBufferAccess local_2a0;
  PixelBufferAccess local_278;
  int local_250;
  int cellSize;
  Vector<float,_4> local_23c;
  undefined1 local_22c [8];
  Vec4 colorB;
  Vector<float,_4> local_20c;
  undefined1 local_1fc [8];
  Vec4 colorA;
  int face;
  int levelH;
  int levelW;
  int ndx;
  deUint32 shaderID;
  GradientShader shader;
  undefined1 local_70 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  int numLevels;
  bool texHasAlpha;
  bool texHasRGB;
  TextureFormat fmt;
  bool targetHasAlpha;
  bool targetHasRGB;
  RenderTarget *renderTarget;
  BasicCopyTexSubImageCubeCase *this_local;
  
  pRVar6 = gles2::Context::getRenderContext((this->super_TextureSpecCase).super_TestCase.m_context);
  iVar1 = (*pRVar6->_vptr_RenderContext[4])();
  register0x00000000 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  pPVar7 = tcu::RenderTarget::getPixelFormat(register0x00000000);
  local_2e1 = false;
  if (0 < pPVar7->redBits) {
    pPVar7 = tcu::RenderTarget::getPixelFormat(stack0xffffffffffffffe0);
    local_2e1 = false;
    if (0 < pPVar7->greenBits) {
      pPVar7 = tcu::RenderTarget::getPixelFormat(stack0xffffffffffffffe0);
      local_2e1 = 0 < pPVar7->blueBits;
    }
  }
  fmt.order._3_1_ = local_2e1;
  pPVar7 = tcu::RenderTarget::getPixelFormat(stack0xffffffffffffffe0);
  fmt.order._2_1_ = 0 < pPVar7->alphaBits;
  _numLevels = (this->super_TextureSpecCase).m_texFormat;
  bVar9 = numLevels == 1;
  bVar10 = true;
  if ((numLevels != 8) && (bVar10 = true, numLevels != 4)) {
    bVar10 = numLevels == 1;
  }
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_2f8 = 1;
  }
  else {
    iVar1 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    iVar2 = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_2f8 = de::max<int>(iVar1,iVar2);
    local_2f8 = local_2f8 + 1;
  }
  data.m_data.m_cap._4_4_ = local_2f8;
  data.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&numLevels);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)local_70,dVar3);
  GradientShader::GradientShader((GradientShader *)&ndx);
  pCVar8 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_TextureSpecCase).super_ContextWrapper);
  dVar3 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&ndx);
  if (((bVar9) || ((fmt.order._3_1_ & 1) != R >> 0x18)) &&
     ((!bVar10 || ((fmt.order._2_1_ & 1) != R >> 0x10)))) {
    sglr::ContextWrapper::glGenTextures
              (&(this->super_TextureSpecCase).super_ContextWrapper,1,(deUint32 *)&data.m_data.m_cap)
    ;
    sglr::ContextWrapper::glBindTexture
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,
               (deUint32)data.m_data.m_cap);
    sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1)
    ;
    for (levelH = 0; levelH < data.m_data.m_cap._4_4_; levelH = levelH + 1) {
      iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
      colorA.m_data[3] =
           (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
      tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar1,(int)colorA.m_data[3],1);
      for (colorA.m_data[2] = 0.0; (int)colorA.m_data[2] < 6;
          colorA.m_data[2] = (float)((int)colorA.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector(&local_20c,0.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0);
        randomVector<4>((Functional *)local_1fc,(Random *)local_70,&local_20c,
                        (Vector<float,_4> *)(colorB.m_data + 2));
        tcu::Vector<float,_4>::Vector(&local_23c,0.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffdb4,1.0);
        randomVector<4>((Functional *)local_22c,(Random *)local_70,&local_23c,
                        (Vector<float,_4> *)&stack0xfffffffffffffdb4);
        local_250 = de::Random::getInt((Random *)local_70,2,0x10);
        tcu::TextureLevel::getAccess(&local_278,(TextureLevel *)&rnd.m_rnd.z);
        tcu::fillWithGrid(&local_278,local_250,(Vec4 *)local_1fc,(Vec4 *)local_22c);
        height = colorA.m_data[3];
        target = *(deUint32 *)(s_cubeMapFaces + (long)(int)colorA.m_data[2] * 4);
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_2a0,(TextureLevel *)&rnd.m_rnd.z);
        data_00 = tcu::PixelBufferAccess::getDataPtr(&local_2a0);
        sglr::ContextWrapper::glTexImage2D
                  (&(this->super_TextureSpecCase).super_ContextWrapper,target,levelH,format,iVar1,
                   (int)height,0,format,type,data_00);
      }
    }
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_TextureSpecCase).super_ContextWrapper);
    tcu::Vector<float,_3>::Vector(&local_2ac,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&levelW_1,1.0,1.0,0.0);
    sglr::drawQuad(pCVar8,dVar3,&local_2ac,(Vec3 *)&levelW_1);
    for (levelH_1 = 0; levelH_1 < data.m_data.m_cap._4_4_; levelH_1 = levelH_1 + 1) {
      iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
      iVar2 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
      for (h = 0; h < 6; h = h + 1) {
        width = de::Random::getInt((Random *)local_70,1,iVar1);
        height_00 = de::Random::getInt((Random *)local_70,1,iVar2);
        xoffset = de::Random::getInt((Random *)local_70,0,iVar1 - width);
        yoffset = de::Random::getInt((Random *)local_70,0,iVar2 - height_00);
        iVar4 = sglr::ContextWrapper::getWidth(&(this->super_TextureSpecCase).super_ContextWrapper);
        iVar4 = de::Random::getInt((Random *)local_70,0,iVar4 - width);
        iVar5 = sglr::ContextWrapper::getHeight(&(this->super_TextureSpecCase).super_ContextWrapper)
        ;
        iVar5 = de::Random::getInt((Random *)local_70,0,iVar5 - height_00);
        sglr::ContextWrapper::glCopyTexSubImage2D
                  (&(this->super_TextureSpecCase).super_ContextWrapper,
                   *(deUint32 *)(s_cubeMapFaces + (long)h * 4),levelH_1,xoffset,yoffset,iVar4,iVar5,
                   width,height_00);
      }
    }
    GradientShader::~GradientShader((GradientShader *)&ndx);
    de::Random::~Random((Random *)local_70);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x5c0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		xo			= rnd.getInt(0, levelW-w);
				int		yo			= rnd.getInt(0, levelH-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}